

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompileType<unsigned_short>(void)

{
  undefined1 uVar1;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  unsigned_short result;
  unsigned_short x;
  bool b2;
  unsigned_short *p4;
  unsigned_short *p3;
  unsigned_short *r;
  unsigned_short *p2;
  unsigned_short *p1;
  longdouble ld;
  double d;
  float f;
  size_t size;
  wchar_t w;
  bool b;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> sb;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  unsigned_short t;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> s;
  SafeInt *this;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff86;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8a;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_e;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_c;
  unsigned_short local_a [4];
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2;
  
  this = (SafeInt *)&local_2;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  local_a[1] = 0;
  local_a[2] = 0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<Foo>
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff86,
                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),(Foo *)this);
  local_a[0] = 0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_c,local_a);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_e,false);
  CompiledMixedType<unsigned_short,char>();
  CompiledMixedType<unsigned_short,signed_char>();
  CompiledMixedType<unsigned_short,unsigned_char>();
  CompiledMixedType<unsigned_short,short>();
  CompiledMixedType<unsigned_short,unsigned_short>();
  CompiledMixedType<unsigned_short,int>();
  CompiledMixedType<unsigned_short,unsigned_int>();
  CompiledMixedType<unsigned_short,long>();
  CompiledMixedType<unsigned_short,unsigned_long>();
  CompiledMixedType<unsigned_short,long_long>();
  CompiledMixedType<unsigned_short,unsigned_long_long>();
  ModulusFriendTest<unsigned_short,char>();
  ModulusFriendTest<unsigned_short,signed_char>();
  ModulusFriendTest<unsigned_short,unsigned_char>();
  ModulusFriendTest<unsigned_short,short>();
  ModulusFriendTest<unsigned_short,unsigned_short>();
  ModulusFriendTest<unsigned_short,int>();
  ModulusFriendTest<unsigned_short,unsigned_int>();
  ModulusFriendTest<unsigned_short,long>();
  ModulusFriendTest<unsigned_short,unsigned_long>();
  ModulusFriendTest<unsigned_short,long_long>();
  ModulusFriendTest<unsigned_short,unsigned_long_long>();
  SafeInt::operator_cast_to_bool(this);
  SafeInt::operator_cast_to_wchar_t
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff86,
                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt::operator_cast_to_unsigned_long
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff86,
                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt::operator_cast_to_float
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff86,
                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt::operator_cast_to_double
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff86,
                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt::operator_cast_to_long_double
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff86,
                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::Ptr(&local_2);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::Ptr(&local_2);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::Ref(&local_2);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&(&local_2)
  ;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&(&local_2)
  ;
  uVar1 = SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator!
                    (&local_c);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+(&local_c)
  ;
  local_a[0] = SafeInt::operator_cast_to_unsigned_short
                         ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                           *)CONCAT26(in_stack_ffffffffffffff86,
                                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
                         );
  SVar2 = SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
                    ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                      *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                CONCAT24(in_stack_ffffffffffffff8c,
                                                         CONCAT22(in_stack_ffffffffffffff8a,
                                                                  in_stack_ffffffffffffff88)))),
                     CONCAT22(in_stack_ffffffffffffff86,in_stack_ffffffffffffff84));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff86,
                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                     CONCAT24(SVar2.m_int,
                                              CONCAT22(in_stack_ffffffffffffff8a,
                                                       in_stack_ffffffffffffff88)))),
             CONCAT22(in_stack_ffffffffffffff86,in_stack_ffffffffffffff84));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff86,
                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator~
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  local_a[0] = SafeInt::operator_cast_to_unsigned_short
                         ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                           *)CONCAT26(in_stack_ffffffffffffff86,
                                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
                         );
  SafeNegation<unsigned_short>(1,(unsigned_short *)this);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}